

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void mips_cpu_set_pc(CPUState *cs,vaddr value)

{
  cs[1].tb_jmp_cache[0x163] = (TranslationBlock *)(value & 0xfffffffffffffffe);
  *(uint *)((long)cs[1].tb_jmp_cache + 0x485c) =
       ((uint)value & 1) << 10 | *(uint *)((long)cs[1].tb_jmp_cache + 0x485c) & 0xfffffbff;
  return;
}

Assistant:

static void mips_cpu_set_pc(CPUState *cs, vaddr value)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;

    env->active_tc.PC = value & ~(target_ulong)1;
    if (value & 1) {
        env->hflags |= MIPS_HFLAG_M16;
    } else {
        env->hflags &= ~(MIPS_HFLAG_M16);
    }
}